

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O1

int __thiscall
CubicLattice::neighbour(CubicLattice *this,int vertexIndex,string *direction,int sign)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *piVar3;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  cartesian4 local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  cartesian4 local_1a8;
  ostringstream local_198 [376];
  
  if ((sign != -1) && (sign != 1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Sign must be either 1 or -1.");
LAB_001321a5:
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = std::__cxx11::string::compare((char *)direction);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)direction);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)direction);
      if (iVar1 != 0) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar3,"Direction must be one of \'x\', \'y\' or \'z\'.");
        goto LAB_001321a5;
      }
    }
  }
  local_1f8 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  if (local_1f8.w == 1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Cubic lattice doesn\'t contain w=0 vertices.");
    goto LAB_001321a5;
  }
  iVar1 = std::__cxx11::string::compare((char *)direction);
  if (iVar1 == 0) {
    local_1f8.x = local_1f8.x + sign;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)direction);
    if (iVar1 == 0) {
      local_1f8.y = local_1f8.y + sign;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)direction);
      if (iVar1 == 0) {
        local_1f8.z = local_1f8.z + sign;
      }
    }
  }
  if ((((-1 < local_1f8.x) && (iVar1 = (this->super_Lattice).l, local_1f8.x < iVar1)) &&
      (-1 < local_1f8.y)) &&
     (((local_1f8.y < iVar1 && (-1 < local_1f8.z)) && (local_1f8.z < iVar1)))) {
    iVar1 = Lattice::coordinateToIndex(&this->super_Lattice,&local_1f8);
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a8 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  local_1c8 = local_1b8;
  local_1c0 = 0;
  local_1b8[0] = '\0';
  if (sign == -1) {
    std::operator+(&local_1e8,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_001320e8;
    std::operator+(&local_1e8,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
LAB_001320e8:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"CubicLattice::neighbour, ",0x19);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," neighbour of ",0xe);
  poVar2 = operator<<(poVar2,&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is outside the lattice.",0x18);
  std::__cxx11::stringbuf::str();
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,(string *)&local_1e8);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = coordinate.x + sign;
        }
        else if (direction == "y")
        {
            coordinate.y = coordinate.y + sign;
        }
        else if (direction == "z")
        {
            coordinate.z = coordinate.z + sign;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "CubicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}